

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

bool __thiscall inja::Parser::parse_expression_and(Parser *this,Template *tmpl)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  
  bVar1 = parse_expression_not(this,tmpl);
  if (bVar1) {
    if ((this->m_tok).kind != Id) {
      return true;
    }
    __x._M_len = (this->m_tok).text._M_len;
    __x._M_str = (this->m_tok).text._M_str;
    __y._M_str = "and";
    __y._M_len = 3;
    bVar1 = std::operator!=(__x,__y);
    if (bVar1) {
      return true;
    }
    get_next_token(this);
    bVar1 = parse_expression_not(this,tmpl);
    if (bVar1) {
      append_function(this,tmpl,And,2);
      return true;
    }
  }
  return false;
}

Assistant:

bool parse_expression_and(Template& tmpl) {
    if (!parse_expression_not(tmpl)) return false;
    if (m_tok.kind != Token::Kind::Id || m_tok.text != static_cast<decltype(m_tok.text)>("and")) return true;
    get_next_token();
    if (!parse_expression_not(tmpl)) return false;
    append_function(tmpl, Bytecode::Op::And, 2);
    return true;
  }